

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

void __thiscall DirectionCone_VectorInCone_Test::TestBody(DirectionCone_VectorInCone_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  char *pcVar4;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  double dVar13;
  undefined1 auVar14 [64];
  Vector3f VVar16;
  Vector3<float> local_f0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  Tuple3<pbrt::Vector3,_float> local_d8;
  Tuple3<pbrt::Vector3,_float> local_c8;
  AssertionResult gtest_ar_1;
  float local_a4;
  AssertHelper local_98;
  int local_8c;
  int local_88;
  Float local_84;
  AssertionResult gtest_ar;
  RNG rng;
  DirectionCone dc;
  undefined1 auVar12 [56];
  undefined1 auVar15 [60];
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  for (local_8c = 0; local_8c != 100; local_8c = local_8c + 1) {
    RandomCone(&dc,&rng);
    for (iVar3 = 0; iVar3 != 100; iVar3 = iVar3 + 1) {
      fVar5 = pbrt::RNG::Uniform<float>(&rng);
      gtest_ar._4_4_ = pbrt::RNG::Uniform<float>(&rng);
      auVar12 = extraout_var;
      gtest_ar._0_4_ = fVar5;
      VVar16 = pbrt::SampleUniformSphere((Point2f *)&gtest_ar);
      local_c8.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar8._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar12;
      local_c8._0_8_ = vmovlps_avx(auVar8._0_16_);
      VVar16 = pbrt::DirectionCone::ClosestVectorInCone(&dc,VVar16);
      local_d8.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar9._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar9._8_56_ = auVar12;
      local_d8._0_8_ = vmovlps_avx(auVar9._0_16_);
      bVar2 = pbrt::Inside(&dc,(Vector3f *)&local_c8);
      if (bVar2) {
        gtest_ar_1.success_ = true;
        gtest_ar_1._1_7_ = 0x3feff7ced91687;
        auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_d8.y * local_c8.y)),ZEXT416((uint)local_d8.x),
                                 ZEXT416((uint)local_c8.x));
        auVar1 = vfmadd132ss_fma(ZEXT416((uint)local_d8.z),auVar1,ZEXT416((uint)local_c8.z));
        local_f0.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar1._0_4_;
        testing::internal::CmpHelperGT<float,double>
                  ((internal *)&gtest_ar,"Dot(wClosest, wRandom)",".999",(float *)&local_f0,
                   (double *)&gtest_ar_1);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_1);
          pcVar4 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_f0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                     ,0x1c6,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_f0,(Message *)&gtest_ar_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_1);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
      else {
        auVar1 = vfnmadd213ss_fma(ZEXT416((uint)dc.cosTheta),ZEXT416((uint)dc.cosTheta),
                                  ZEXT416(0x3f800000));
        auVar1 = vmaxss_avx(auVar1,ZEXT416(0));
        auVar1 = vsqrtss_avx(auVar1,auVar1);
        local_84 = auVar1._0_4_;
        local_88 = iVar3;
        pbrt::Frame::FromZ((Frame *)&gtest_ar,&dc.w);
        local_f0.super_Tuple3<pbrt::Vector3,_float>._0_8_ = 0;
        local_f0.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        dVar13 = 0.0;
        iVar3 = 1000;
        local_a4 = -1.0;
        while (bVar2 = iVar3 != 0, iVar3 = iVar3 + -1, bVar2) {
          auVar15 = (undefined1  [60])0x0;
          dVar6 = (dVar13 + 0.5) / 1000.0;
          auVar12 = (undefined1  [56])0x0;
          VVar16 = pbrt::SphericalDirection
                             (local_84,dc.cosTheta,(float)((dVar6 + dVar6) * 3.1415927410125732));
          gtest_ar_1.message_.ptr_._0_4_ = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar10._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar10._8_56_ = auVar12;
          gtest_ar_1._0_8_ = vmovlps_avx(auVar10._0_16_);
          VVar16 = pbrt::Frame::FromLocal((Frame *)&gtest_ar,(Vector3f *)&gtest_ar_1);
          auVar14._0_4_ = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar14._4_60_ = auVar15;
          auVar11._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar11._8_56_ = auVar12;
          auVar7 = auVar11._0_16_;
          auVar1 = vmovshdup_avx(auVar7);
          gtest_ar_1._0_8_ = vmovlps_avx(auVar7);
          auVar1 = vfmadd231ss_fma(ZEXT416((uint)(auVar1._0_4_ * local_c8.y)),auVar7,
                                   ZEXT416((uint)local_c8.x));
          auVar1 = vfmadd231ss_fma(auVar1,auVar14._0_16_,ZEXT416((uint)local_c8.z));
          if (local_a4 < auVar1._0_4_) {
            local_f0.super_Tuple3<pbrt::Vector3,_float>._0_8_ = gtest_ar_1._0_8_;
            local_f0.super_Tuple3<pbrt::Vector3,_float>.z = auVar14._0_4_;
            local_a4 = auVar1._0_4_;
          }
          dVar13 = dVar13 + 1.0;
          gtest_ar_1.message_.ptr_._0_4_ = auVar14._0_4_;
        }
        local_e0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             0x3feff7ced916872b;
        auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_f0.super_Tuple3<pbrt::Vector3,_float>.y *
                                               local_d8.y)),
                                 ZEXT416((uint)local_f0.super_Tuple3<pbrt::Vector3,_float>.x),
                                 ZEXT416((uint)local_d8.x));
        auVar1 = vfmadd132ss_fma(ZEXT416((uint)local_f0.super_Tuple3<pbrt::Vector3,_float>.z),auVar1
                                 ,ZEXT416((uint)local_d8.z));
        local_98.data_._0_4_ = auVar1._0_4_;
        testing::internal::CmpHelperGT<float,double>
                  ((internal *)&gtest_ar_1,"Dot(wBest, wClosest)",".999",(float *)&local_98,
                   (double *)&local_e0);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)&local_e0);
          pbrt::operator<<((ostream *)(local_e0.ptr_ + 0x10),&local_f0);
          std::operator<<((ostream *)(local_e0.ptr_ + 0x10)," vs ");
          pbrt::operator<<((ostream *)(local_e0.ptr_ + 0x10),(Vector3<float> *)&local_d8);
          std::operator<<((ostream *)(local_e0.ptr_ + 0x10),", dot ");
          auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_f0.super_Tuple3<pbrt::Vector3,_float>.y *
                                                 local_d8.y)),
                                   ZEXT416((uint)local_f0.super_Tuple3<pbrt::Vector3,_float>.x),
                                   ZEXT416((uint)local_d8.x));
          auVar1 = vfmadd132ss_fma(ZEXT416((uint)local_f0.super_Tuple3<pbrt::Vector3,_float>.z),
                                   auVar1,ZEXT416((uint)local_d8.z));
          std::ostream::operator<<(local_e0.ptr_ + 0x10,auVar1._0_4_);
          pcVar4 = "";
          if ((undefined8 *)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,gtest_ar_1.message_.ptr_._0_4_)
              != (undefined8 *)0x0) {
            pcVar4 = *(char **)CONCAT44(gtest_ar_1.message_.ptr_._4_4_,
                                        gtest_ar_1.message_.ptr_._0_4_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                     ,0x1d9,pcVar4);
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
          testing::internal::AssertHelper::~AssertHelper(&local_98);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_e0);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_1.message_);
        iVar3 = local_88;
      }
    }
  }
  return;
}

Assistant:

TEST(DirectionCone, VectorInCone) {
    RNG rng;
    for (int i = 0; i < 100; ++i) {
        DirectionCone dc = RandomCone(rng);

        for (int j = 0; j < 100; ++j) {
            Vector3f wRandom =
                SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
            Vector3f wClosest = dc.ClosestVectorInCone(wRandom);

            if (Inside(dc, wRandom))
                EXPECT_GT(Dot(wClosest, wRandom), .999);
            else {
                // Uniformly sample the circle at the cone's boundary and
                // keep the vector that's closest to wRandom.
                Float sinTheta = SafeSqrt(1 - dc.cosTheta * dc.cosTheta);
                Frame f = Frame::FromZ(dc.w);

                Vector3f wBest;
                Float bestDot = -1;
                const int nk = 1000;
                for (int k = 0; k < nk; ++k) {
                    Float phi = (k + .5) / nk * 2 * Pi;
                    Vector3f w = SphericalDirection(sinTheta, dc.cosTheta, phi);
                    w = f.FromLocal(w);
                    if (Dot(w, wRandom) > bestDot) {
                        wBest = w;
                        bestDot = Dot(w, wRandom);
                    }
                }
                EXPECT_GT(Dot(wBest, wClosest), .999)
                    << wBest << " vs " << wClosest << ", dot " << Dot(wBest, wClosest);
            }
        }
    }
}